

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

void __thiscall MD5::update(MD5 *this,uchar *input,size_type length)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = this->count[0];
  uVar4 = uVar1 >> 3 & 0x3f;
  uVar3 = (ulong)uVar4;
  this->count[0] = length * 8 + uVar1;
  if (CARRY4(length * 8,uVar1)) {
    this->count[1] = this->count[1] + 1;
  }
  this->count[1] = this->count[1] + (length >> 0x1d);
  uVar1 = 0x40 - uVar4;
  if (length < uVar1) {
    uVar2 = 0;
  }
  else {
    memcpy(this->buffer + uVar3,input,(ulong)uVar1);
    transform(this,this->buffer);
    uVar4 = -uVar4;
    while (uVar2 = uVar1, uVar3 = 0, uVar4 + 0x80 <= length) {
      transform(this,input + uVar2);
      uVar1 = uVar2 + 0x40;
      uVar4 = uVar2;
    }
  }
  memcpy(this->buffer + uVar3,input + uVar2,(ulong)(length - uVar2));
  return;
}

Assistant:

void MD5::update(const unsigned char input[], size_type length)
{
  // compute number of bytes mod 64
  size_type index = count[0] / 8 % blocksize;
 
  // Update number of bits
  if ((count[0] += (length << 3)) < (length << 3))
    count[1]++;
  count[1] += (length >> 29);
 
  // number of bytes we need to fill in buffer
  size_type firstpart = 64 - index;
 
  size_type i;
 
  // transform as many times as possible.
  if (length >= firstpart)
  {
    // fill buffer first, transform
    memcpy(&buffer[index], input, firstpart);
    transform(buffer);
 
    // transform chunks of blocksize (64 bytes)
    for (i = firstpart; i + blocksize <= length; i += blocksize)
      transform(&input[i]);
 
    index = 0;
  }
  else
    i = 0;
 
  // buffer remaining input
  memcpy(&buffer[index], &input[i], length-i);
}